

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::MixtureIngredient::calcGeometricProps
          (MixtureIngredient *this,ChVector<double> *size,double *volume,ChVector<double> *gyration)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 extraout_var [56];
  
  switch(this->m_type) {
  case SPHERE:
    dVar1 = size->m_data[0];
    *volume = dVar1 * dVar1 * dVar1 * 4.1887902047863905;
    dVar22 = size->m_data[0] * size->m_data[0] * 0.4;
    auVar7._8_8_ = dVar22;
    auVar7._0_8_ = dVar22;
    break;
  case ELLIPSOID:
    *volume = size->m_data[0] * 4.1887902047863905 * size->m_data[1] * size->m_data[2];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = size->m_data[0];
    auVar31._8_8_ = size->m_data[2];
    auVar31._0_8_ = size->m_data[2];
    auVar2 = *(undefined1 (*) [16])(size->m_data + 1);
    auVar12 = vunpcklpd_avx(auVar31,auVar15);
    auVar32._0_8_ = auVar12._0_8_ * auVar12._0_8_;
    auVar32._8_8_ = auVar12._8_8_ * auVar12._8_8_;
    auVar12 = vfmadd231pd_fma(auVar32,auVar2,auVar2);
    auVar6._8_8_ = 0x3fc999999999999a;
    auVar6._0_8_ = 0x3fc999999999999a;
    auVar7 = vmulpd_avx512vl(auVar12,auVar6);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar2._0_8_ * auVar2._0_8_;
    auVar2 = vfmadd231sd_fma(auVar42,auVar15,auVar15);
    dVar22 = auVar2._0_8_ * 0.2;
    break;
  case BOX:
    *volume = size->m_data[0] * 8.0 * size->m_data[1] * size->m_data[2];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = size->m_data[0];
    auVar25._8_8_ = size->m_data[2];
    auVar25._0_8_ = size->m_data[2];
    auVar2 = *(undefined1 (*) [16])(size->m_data + 1);
    auVar12 = vunpcklpd_avx(auVar25,auVar9);
    auVar26._0_8_ = auVar12._0_8_ * auVar12._0_8_;
    auVar26._8_8_ = auVar12._8_8_ * auVar12._8_8_;
    auVar12 = vfmadd231pd_fma(auVar26,auVar2,auVar2);
    auVar5._8_8_ = 0x3fd5555555555555;
    auVar5._0_8_ = 0x3fd5555555555555;
    auVar7 = vmulpd_avx512vl(auVar12,auVar5);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auVar2._0_8_ * auVar2._0_8_;
    auVar2 = vfmadd231sd_fma(auVar38,auVar9,auVar9);
    dVar22 = auVar2._0_8_ * 0.3333333333333333;
    break;
  case CYLINDER:
    *volume = size->m_data[0] * size->m_data[0] * 6.283185307179586 * size->m_data[1];
    dVar1 = size->m_data[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = size->m_data[1] * size->m_data[1] * 4.0;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar1 * 3.0;
    auVar2 = vfmadd231sd_fma(auVar27,auVar10,auVar39);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1 * dVar1;
    auVar2 = vunpcklpd_avx(auVar2,auVar11);
    goto LAB_00917e0e;
  case CONE:
    *volume = (size->m_data[0] * size->m_data[0] * 3.141592653589793 * size->m_data[1]) / 3.0;
    dVar1 = size->m_data[0] * size->m_data[0];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1 * 0.15;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = size->m_data[1] * size->m_data[1];
    auVar2 = vfmadd231sd_fma(auVar8,auVar23,ZEXT816(0x3fa3333333333333));
    dVar22 = auVar2._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar1 * 0.3;
    auVar7 = vunpcklpd_avx(auVar2,auVar24);
    break;
  case CAPSULE:
    dVar1 = size->m_data[0];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = size->m_data[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar1 * dVar1 * dVar1 * 0.6666666666666666;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar1 * dVar1;
    auVar2 = vfmadd231sd_fma(auVar16,auVar33,auVar3);
    *volume = auVar2._0_8_ * 6.283185307179586;
    dVar1 = size->m_data[1];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar1;
    dVar22 = size->m_data[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar22;
    auVar2 = vfmadd213sd_fma(ZEXT816(0x3fd8000000000000),auVar17,auVar34);
    dVar37 = (dVar1 * 1.5) / dVar22;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar1 * dVar1 * 4.0;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar22 * 3.0;
    auVar12 = vfmadd231sd_fma(auVar35,auVar17,auVar56);
    dVar1 = dVar37 + 1.0;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar2._0_8_ * auVar2._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar22 * 0.259;
    auVar2 = vfmadd231sd_fma(auVar48,auVar17,auVar57);
    dVar37 = dVar37 / dVar1;
    auVar52._0_8_ = 1.0 / dVar1;
    auVar52._8_8_ = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar22 * dVar22;
    auVar2 = vunpcklpd_avx(auVar2,auVar18);
    auVar12 = vunpcklpd_avx(auVar12,auVar18);
    auVar43._0_8_ = dVar37 * 0.08333333333333333;
    auVar43._8_8_ = dVar37 * 0.5;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auVar52._0_8_ * 0.4;
    auVar13 = vunpcklpd_avx(auVar52,auVar54);
    auVar49._0_8_ = auVar2._0_8_ * auVar13._0_8_;
    auVar49._8_8_ = auVar2._8_8_ * auVar13._8_8_;
    auVar7 = vfmadd213pd_fma(auVar12,auVar43,auVar49);
    goto LAB_00918098;
  case BISPHERE:
    dVar1 = size->m_data[0];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar1;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = size->m_data[1];
    auVar2 = vfmsub231sd_fma(auVar44,auVar19,ZEXT816(0x4000000000000000));
    auVar2 = vfmadd213sd_fma(auVar2,ZEXT816(0xbfe0000000000000),auVar19);
    *volume = dVar1 * dVar1 * dVar1 * 4.1887902047863905 * (auVar2._0_8_ / dVar1 + 1.0);
    dVar1 = size->m_data[0];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = size->m_data[1];
    auVar2 = vfmsub213sd_fma(ZEXT816(0x4000000000000000),auVar53,auVar4);
    auVar2 = vfmadd213sd_fma(auVar2,ZEXT816(0xbfe0000000000000),auVar53);
    dVar22 = auVar2._0_8_;
    auVar50._0_8_ = dVar22 / dVar1;
    auVar50._8_8_ = auVar2._8_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = auVar50._0_8_ * auVar50._0_8_;
    auVar2 = vfnmadd213sd_fma(auVar55,auVar50,ZEXT816(0xbff0000000000000));
    auVar12 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar50,auVar50);
    if (auVar12._0_8_ < 0.0) {
      auVar21._0_8_ = sqrt(auVar12._0_8_);
      auVar21._8_56_ = extraout_var;
      auVar12 = auVar21._0_16_;
    }
    else {
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
    }
    dVar37 = auVar50._0_8_ + 1.0;
    auVar12 = vunpcklpd_avx(auVar12,auVar53);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar37;
    auVar14 = vfmadd132sd_fma(auVar2,auVar36,ZEXT816(0x3fd5555555555555));
    auVar45._8_8_ = 0x4000000000000000;
    auVar45._0_8_ = 0x4000000000000000;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar37 * 1.3333333333333333;
    auVar2 = vunpcklpd_avx(auVar51,auVar36);
    auVar13 = vunpcklpd_avx(auVar45,auVar14);
    auVar20._0_8_ =
         (dVar22 * 0.6666666666666666 * dVar22 * dVar37 +
          (dVar1 * dVar1 * 0.4 * dVar37 - dVar1 * dVar1 * 0.2 * auVar14._0_8_) +
         auVar12._0_8_ * dVar1 * 0.5 * dVar22) * auVar13._0_8_;
    auVar20._8_8_ = auVar12._8_8_ * auVar12._8_8_ * 0.6 * auVar13._8_8_;
    auVar7 = vdivpd_avx(auVar20,auVar2);
    goto LAB_00918098;
  case ROUNDEDCYLINDER:
    dVar1 = size->m_data[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar1;
    dVar22 = size->m_data[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar22;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar1 * dVar1 * 0.6666666666666666;
    auVar12 = vfmadd231sd_fma(auVar46,auVar12,auVar12);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = size->m_data[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (dVar22 + dVar1) * (dVar22 + dVar1);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar1 * auVar12._0_8_;
    auVar2 = vfmadd231sd_fma(auVar47,auVar40,auVar2);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar22 * 0.5707963267948966 * dVar1;
    auVar2 = vfmadd213sd_fma(auVar13,auVar28,auVar2);
    *volume = auVar2._0_8_ * 6.283185307179586;
    dVar1 = size->m_data[2] + size->m_data[0];
    dVar22 = size->m_data[2] + size->m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar22 * dVar22 * 4.0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar1;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar1 * 3.0;
    auVar2 = vfmadd231sd_fma(auVar14,auVar29,auVar41);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar1 * dVar1;
    auVar2 = vunpcklpd_avx(auVar2,auVar30);
LAB_00917e0e:
    auVar7._0_8_ = auVar2._0_8_ * 0.08333333333333333;
    auVar7._8_8_ = auVar2._8_8_ * 0.5;
LAB_00918098:
    dVar22 = auVar7._0_8_;
    break;
  default:
    goto switchD_00917c75_default;
  }
  *(undefined1 (*) [16])gyration->m_data = auVar7;
  gyration->m_data[2] = dVar22;
switchD_00917c75_default:
  return;
}

Assistant:

void MixtureIngredient::calcGeometricProps(const ChVector<>& size, double& volume, ChVector<>& gyration) {
    switch (m_type) {
        case MixtureType::SPHERE:
            volume = CalcSphereVolume(size.x());
            gyration = CalcSphereGyration(size.x()).diagonal();
            break;
        case MixtureType::ELLIPSOID:
            volume = CalcEllipsoidVolume(size);
            gyration = CalcEllipsoidGyration(size).diagonal();
            break;
        case MixtureType::BOX:
            volume = CalcBoxVolume(size);
            gyration = CalcBoxGyration(size).diagonal();
            break;
        case MixtureType::CYLINDER:
            volume = CalcCylinderVolume(size.x(), size.y());
            gyration = CalcCylinderGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CONE:
            volume = CalcConeVolume(size.x(), size.y());
            gyration = CalcConeGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::BISPHERE:
            volume = CalcBiSphereVolume(size.x(), size.y());
            gyration = CalcBiSphereGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CAPSULE:
            volume = CalcCapsuleVolume(size.x(), size.y());
            gyration = CalcCapsuleGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::ROUNDEDCYLINDER:
            volume = CalcRoundedCylinderVolume(size.x(), size.y(), size.z());
            gyration = CalcRoundedCylinderGyration(size.x(), size.y(), size.z()).diagonal();
            break;
    }
}